

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.h
# Opt level: O2

uint32_t __thiscall
GmmLib::GmmResourceInfoCommon::IsResourceMappedCompressible(GmmResourceInfoCommon *this)

{
  anon_struct_8_44_94931171_for_Info aVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  
  iVar2 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
  aVar1 = (this->Surf).Flags.Info;
  if ((*(byte *)(CONCAT44(extraout_var,iVar2) + 0x20) & 4) == 0) {
    uVar3 = 1;
    if ((aVar1._0_4_ >> 0x1d & 1) == 0) {
      uVar3 = (uint)((ulong)aVar1 >> 0x14) & 1;
    }
  }
  else {
    uVar3 = (uint)(((ulong)aVar1 >> 0x2d & 1) == 0);
  }
  return uVar3;
}

Assistant:

GMM_INLINE_VIRTUAL GMM_INLINE_EXPORTED uint32_t GMM_STDCALL IsResourceMappedCompressible()
            {
                uint32_t CompressedRes = 0;
                if (GetGmmLibContext()->GetSkuTable().FtrXe2Compression)
                {
                    CompressedRes = !Surf.Flags.Info.NotCompressed;
                }
                else
                {
                    CompressedRes = Surf.Flags.Info.RenderCompressed || Surf.Flags.Info.MediaCompressed;
                }

                return CompressedRes;
            }